

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimplifyGlobals.cpp
# Opt level: O0

void __thiscall wasm::SimplifyGlobals::preferEarlierImports(SimplifyGlobals *this)

{
  bool bVar1;
  vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
  *pvVar2;
  Global *pGVar3;
  pointer pGVar4;
  size_type sVar5;
  mapped_type *pmVar6;
  mapped_type *this_00;
  PassRunner *runner;
  GlobalUseModifier local_1e8;
  undefined1 auStack_d8 [8];
  Name child_1;
  unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *global_1;
  iterator __end3;
  iterator __begin3;
  vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
  *__range3;
  undefined1 auStack_98 [8];
  Name parent;
  GlobalGet *get;
  undefined1 local_70 [8];
  Name child;
  unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *global;
  iterator __end2;
  iterator __begin2;
  vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
  *__range2;
  NameNameMap copiedParentMap;
  SimplifyGlobals *this_local;
  
  copiedParentMap._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)this;
  std::
  map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
  ::map((map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
         *)&__range2);
  pvVar2 = &this->module->globals;
  __end2 = std::
           vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
           ::begin(pvVar2);
  global = (unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *)
           std::
           vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
           ::end(pvVar2);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_*,_std::vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>_>
                                     *)&global), bVar1) {
    child.super_IString.str._M_str =
         (char *)__gnu_cxx::
                 __normal_iterator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_*,_std::vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>_>
                 ::operator*(&__end2);
    pGVar4 = std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::operator->
                       ((unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *)
                        child.super_IString.str._M_str);
    local_70 = (undefined1  [8])(pGVar4->super_Importable).super_Named.name.super_IString.str._M_len
    ;
    child.super_IString.str._M_len =
         (size_t)(pGVar4->super_Importable).super_Named.name.super_IString.str._M_str;
    pGVar4 = std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::operator->
                       ((unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *)
                        child.super_IString.str._M_str);
    if ((pGVar4->mutable_ & 1U) == 0) {
      pGVar4 = std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::operator->
                         ((unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *)
                          child.super_IString.str._M_str);
      bVar1 = Importable::imported(&pGVar4->super_Importable);
      if (!bVar1) {
        pGVar4 = std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::operator->
                           ((unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *)
                            child.super_IString.str._M_str);
        parent.super_IString.str._M_str = (char *)Expression::dynCast<wasm::GlobalGet>(pGVar4->init)
        ;
        if ((GlobalGet *)parent.super_IString.str._M_str != (GlobalGet *)0x0) {
          auStack_98 = (undefined1  [8])
                       (((GlobalGet *)parent.super_IString.str._M_str)->name).super_IString.str.
                       _M_len;
          parent.super_IString.str._M_len =
               (size_t)(((GlobalGet *)parent.super_IString.str._M_str)->name).super_IString.str.
                       _M_str;
          pGVar3 = Module::getGlobal(this->module,
                                     (Name)(((GlobalGet *)parent.super_IString.str._M_str)->name).
                                           super_IString.str);
          if ((pGVar3->mutable_ & 1U) == 0) {
            pmVar6 = std::
                     map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                     ::operator[]((map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                                   *)&__range2,(key_type *)local_70);
            wasm::Name::operator=(pmVar6,(Name *)auStack_98);
          }
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_*,_std::vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>_>
    ::operator++(&__end2);
  }
  bVar1 = std::
          map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
          ::empty((map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                   *)&__range2);
  if (!bVar1) {
    pvVar2 = &this->module->globals;
    __end3 = std::
             vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
             ::begin(pvVar2);
    global_1 = (unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *)
               std::
               vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
               ::end(pvVar2);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_*,_std::vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>_>
                                       *)&global_1), bVar1) {
      child_1.super_IString.str._M_str =
           (char *)__gnu_cxx::
                   __normal_iterator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_*,_std::vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>_>
                   ::operator*(&__end3);
      pGVar4 = std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::operator->
                         ((unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *)
                          child_1.super_IString.str._M_str);
      auStack_d8 = (undefined1  [8])
                   (pGVar4->super_Importable).super_Named.name.super_IString.str._M_len;
      child_1.super_IString.str._M_len =
           (size_t)(pGVar4->super_Importable).super_Named.name.super_IString.str._M_str;
      sVar5 = std::
              map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
              ::count((map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                       *)&__range2,(key_type *)auStack_d8);
      if (sVar5 != 0) {
        while( true ) {
          pmVar6 = std::
                   map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                   ::operator[]((map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                                 *)&__range2,(key_type *)auStack_d8);
          sVar5 = std::
                  map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                  ::count((map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                           *)&__range2,pmVar6);
          if (sVar5 == 0) break;
          pmVar6 = std::
                   map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                   ::operator[]((map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                                 *)&__range2,(key_type *)auStack_d8);
          pmVar6 = std::
                   map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                   ::operator[]((map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                                 *)&__range2,pmVar6);
          this_00 = std::
                    map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                    ::operator[]((map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                                  *)&__range2,(key_type *)auStack_d8);
          wasm::Name::operator=(this_00,pmVar6);
        }
      }
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_*,_std::vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>_>
      ::operator++(&__end3);
    }
    anon_unknown_224::GlobalUseModifier::GlobalUseModifier(&local_1e8,(NameNameMap *)&__range2);
    runner = Pass::getPassRunner(&this->super_Pass);
    WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::GlobalUseModifier,_wasm::Visitor<wasm::(anonymous_namespace)::GlobalUseModifier,_void>_>_>
    ::run(&local_1e8.
           super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::GlobalUseModifier,_wasm::Visitor<wasm::(anonymous_namespace)::GlobalUseModifier,_void>_>_>
          ,runner,this->module);
    anon_unknown_224::GlobalUseModifier::~GlobalUseModifier(&local_1e8);
  }
  std::
  map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
  ::~map((map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
          *)&__range2);
  return;
}

Assistant:

void preferEarlierImports() {
    // Optimize uses of immutable globals, prefer the earlier import when
    // there is a copy.
    NameNameMap copiedParentMap;
    for (auto& global : module->globals) {
      auto child = global->name;
      if (!global->mutable_ && !global->imported()) {
        if (auto* get = global->init->dynCast<GlobalGet>()) {
          auto parent = get->name;
          if (!module->getGlobal(get->name)->mutable_) {
            copiedParentMap[child] = parent;
          }
        }
      }
    }
    if (!copiedParentMap.empty()) {
      // Go all the way back.
      for (auto& global : module->globals) {
        auto child = global->name;
        if (copiedParentMap.count(child)) {
          while (copiedParentMap.count(copiedParentMap[child])) {
            copiedParentMap[child] = copiedParentMap[copiedParentMap[child]];
          }
        }
      }
      // Apply to the gets.
      GlobalUseModifier(&copiedParentMap).run(getPassRunner(), module);
    }
  }